

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O2

REF_STATUS ref_egads_tess(REF_GRID ref_grid,REF_INT auto_tparams,REF_DBL *global_params)

{
  printf("returning empty grid from %s, No EGADS linked.\n","ref_egads_tess");
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_egads_tess(REF_GRID ref_grid, REF_INT auto_tparams,
                                  REF_DBL *global_params) {
#ifdef HAVE_EGADS
  ego tess;
  REF_GLOB n_global;

  if (ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_egads_tess_create(ref_grid_geom(ref_grid), &tess, auto_tparams,
                              global_params),
        "create tess object");

    RSS(ref_egads_tess_fill_vertex(ref_grid, tess, &n_global),
        "fill tess vertex");
    RSS(ref_egads_tess_fill_tri(ref_grid, tess, n_global),
        "fill tess triangles");
    RSS(ref_egads_tess_fill_edg(ref_grid, tess, n_global), "fill tess edges");
  }

  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &n_global, 1, REF_GLOB_TYPE),
      "bcast glob");
  RSS(ref_node_initialize_n_global(ref_grid_node(ref_grid), n_global),
      "init glob");

  RSS(ref_egads_mark_jump_degen(ref_grid), "T and UV jumps");
  ref_grid_surf(ref_grid) = REF_TRUE;

#else
  printf("returning empty grid from %s, No EGADS linked.\n", __func__);
  SUPRESS_UNUSED_COMPILER_WARNING(ref_grid);
  SUPRESS_UNUSED_COMPILER_WARNING(auto_tparams);
  SUPRESS_UNUSED_COMPILER_WARNING(global_params);
#endif

  return REF_SUCCESS;
}